

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O3

JavascriptBigInt *
Js::JavascriptBigInt::CreateZeroWithLength(digit_t length,ScriptContext *scriptContext)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Recycler *pRVar5;
  JavascriptBigInt *this;
  undefined4 *puVar6;
  unsigned_long *puVar7;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_82e85b8;
  data.filename._0_4_ = 0x15;
  pRVar5 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  this = (JavascriptBigInt *)new<Memory::Recycler>(0x30,pRVar5,0x387914);
  JavascriptBigInt(this,(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                        bigintTypeStatic).ptr);
  this->m_length = length;
  this->m_isNegative = false;
  this->m_maxLength = length;
  local_58 = (undefined1  [8])&unsigned_long::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_82e85b8;
  data.filename._0_4_ = 0x19;
  data.plusSize = length;
  pRVar5 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  uVar1 = this->m_length;
  if (uVar1 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar5,(TrackAllocData *)0x0);
    puVar7 = (unsigned_long *)&DAT_00000008;
  }
  else {
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00d20dbd;
      *puVar6 = 0;
    }
    puVar7 = (unsigned_long *)
             Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                       (pRVar5,-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
    if (puVar7 == (unsigned_long *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00d20dbd:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
      puVar7 = (unsigned_long *)0x0;
    }
  }
  Memory::Recycler::WBSetBit((char *)&this->m_digits);
  (this->m_digits).ptr = puVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_digits);
  return this;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::CreateZeroWithLength(digit_t length, ScriptContext * scriptContext)
    {
        JavascriptBigInt * bigintNew = RecyclerNew(scriptContext->GetRecycler(), JavascriptBigInt, scriptContext->GetLibrary()->GetBigIntTypeStatic());
        bigintNew->m_length = length;
        bigintNew->m_isNegative = false;
        bigintNew->m_maxLength = length;
        bigintNew->m_digits = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), digit_t, bigintNew->m_length);
        return bigintNew;
    }